

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

void absl::debugging_internal::MaybeAppendWithLength(State *state,char *str,size_t length)

{
  bool bVar1;
  size_t in_RDX;
  char *in_RSI;
  State *in_RDI;
  
  if ((*(int *)&(in_RDI->parse_state).field_0xc < 0) && (in_RDX != 0)) {
    if ((*in_RSI == '<') && (bVar1 = EndsWith(in_RDI,'<'), bVar1)) {
      Append(in_RDI," ",1);
    }
    if (((in_RDI->parse_state).out_cur_idx < in_RDI->out_end_idx) &&
       ((bVar1 = IsAlpha(*in_RSI), bVar1 || (*in_RSI == '_')))) {
      (in_RDI->parse_state).prev_name_idx = (in_RDI->parse_state).out_cur_idx;
      *(uint *)&(in_RDI->parse_state).field_0xc =
           *(uint *)&(in_RDI->parse_state).field_0xc & 0xffff0000 | (uint)in_RDX & 0xffff;
    }
    Append(in_RDI,in_RSI,in_RDX);
  }
  return;
}

Assistant:

static void MaybeAppendWithLength(State *state, const char *const str,
                                  const size_t length) {
  if (state->parse_state.append && length > 0) {
    // Append a space if the output buffer ends with '<' and "str"
    // starts with '<' to avoid <<<.
    if (str[0] == '<' && EndsWith(state, '<')) {
      Append(state, " ", 1);
    }
    // Remember the last identifier name for ctors/dtors,
    // but only if we haven't yet overflown the buffer.
    if (state->parse_state.out_cur_idx < state->out_end_idx &&
        (IsAlpha(str[0]) || str[0] == '_')) {
      state->parse_state.prev_name_idx = state->parse_state.out_cur_idx;
      state->parse_state.prev_name_length = static_cast<unsigned int>(length);
    }
    Append(state, str, length);
  }
}